

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O0

int bit_encode_write(bit_encode_t *be,uchar *bits,int nbits)

{
  int local_24;
  int local_20;
  int i;
  int tbits;
  int nbits_local;
  uchar *bits_local;
  bit_encode_t *be_local;
  
  local_20 = nbits + (uint)be->bbits;
  if (local_20 < 8) {
    be->buf = be->buf | (byte)(((int)(uint)*bits >> (8U - (char)nbits & 0x1f)) <<
                              (8U - (char)local_20 & 0x1f));
  }
  else {
    local_24 = 0;
    for (; 7 < local_20; local_20 = local_20 + -8) {
      fputc((uint)be->buf | (int)(uint)bits[local_24] >> (be->bbits & 0x1f),(FILE *)be->fh);
      be->buf = bits[local_24] << (8 - be->bbits & 0x1f);
      local_24 = local_24 + 1;
    }
  }
  be->bbits = (uchar)local_20;
  return nbits;
}

Assistant:

int
bit_encode_write(bit_encode_t *be, unsigned char const *bits, int nbits)
{
    int tbits;

    tbits = nbits + be->bbits;
    if (tbits < 8)  {
        /* Append to buffer. */
        be->buf |= ((bits[0] >> (8 - nbits)) << (8 - tbits));
    }
    else {
        int i = 0;
        while (tbits >= 8) {
            /* Shift bits out of the buffer and splice with high-order bits */
            fputc(be->buf | ((bits[i]) >> be->bbits), be->fh);
            /* Put low-order bits back into buffer */
            be->buf = (bits[i] << (8 - be->bbits)) & 0xff;
            tbits -= 8;
            ++i;
        }
    }
    /* tbits contains remaining number of  bits. */
    be->bbits = tbits;

    return nbits;
}